

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

int run_array_container_andnot(run_container_t *src_1,array_container_t *src_2,container_t **dst)

{
  int iVar1;
  bool bVar2;
  rle16_t rVar3;
  rle16_t rVar4;
  rle16_t rVar5;
  _Bool _Var6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  run_container_t *prVar11;
  container_t *pcVar12;
  array_container_t *paVar13;
  bitset_container_t *src_1_00;
  uint16_t uVar14;
  long *in_RDX;
  array_container_t *in_RSI;
  int *in_RDI;
  _Bool result_is_bitset;
  bitset_container_t *ans;
  array_container_t *ac;
  uint8_t return_type;
  int32_t xstart;
  int32_t end;
  int32_t start;
  rle16_t rle;
  int xrlepos;
  int rlepos;
  run_container_t *answer;
  int arbitrary_threshold;
  int card;
  undefined4 in_stack_ffffffffffffff88;
  int32_t in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  run_container_t *in_stack_ffffffffffffffa0;
  byte local_55;
  undefined2 in_stack_ffffffffffffffb0;
  undefined2 in_stack_ffffffffffffffb2;
  undefined2 in_stack_ffffffffffffffb4;
  undefined2 in_stack_ffffffffffffffb6;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined2 in_stack_ffffffffffffffc4;
  undefined2 in_stack_ffffffffffffffc6;
  int local_38;
  int local_34;
  undefined4 uVar15;
  uint local_4;
  
  iVar7 = run_container_cardinality
                    ((run_container_t *)
                     CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  uVar15 = 0x20;
  if (iVar7 < 0x21) {
    if (in_RSI->cardinality == 0) {
      prVar11 = run_container_clone((run_container_t *)
                                    CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
      *in_RDX = (long)prVar11;
      local_4 = 3;
    }
    else {
      array_container_cardinality(in_RSI);
      prVar11 = run_container_create_given_capacity(in_stack_ffffffffffffff8c);
      local_34 = 0;
      local_38 = 0;
      uVar10 = **(uint **)(in_RDI + 2) & 0xffff;
      uVar8 = uVar10 + (**(uint **)(in_RDI + 2) >> 0x10) + 1;
      uVar9 = (uint)*in_RSI->array;
      while( true ) {
        bVar2 = false;
        if (local_34 < *in_RDI) {
          bVar2 = local_38 < in_RSI->cardinality;
        }
        uVar14 = (uint16_t)uVar10;
        if (!bVar2) break;
        if (uVar9 < uVar8) {
          if (uVar10 < uVar9 + 1) {
            if (uVar10 < uVar9) {
              iVar1 = prVar11->n_runs;
              prVar11->n_runs = iVar1 + 1;
              rVar3.length = ((short)uVar9 - uVar14) - 1;
              rVar3.value = uVar14;
              prVar11->runs[iVar1] = rVar3;
            }
            if (uVar9 + 1 < uVar8) {
              uVar10 = uVar9 + 1;
            }
            else {
              local_34 = local_34 + 1;
              if (local_34 < *in_RDI) {
                uVar10 = (uint)*(ushort *)(*(long *)(in_RDI + 2) + (long)local_34 * 4);
                uVar8 = uVar10 + *(ushort *)(*(long *)(in_RDI + 2) + 2 + (long)local_34 * 4) + 1;
              }
            }
          }
          else {
            local_38 = local_38 + 1;
            if (local_38 < in_RSI->cardinality) {
              uVar9 = (uint)in_RSI->array[local_38];
            }
          }
        }
        else {
          iVar1 = prVar11->n_runs;
          prVar11->n_runs = iVar1 + 1;
          rVar4.length = ((short)uVar8 - uVar14) - 1;
          rVar4.value = uVar14;
          prVar11->runs[iVar1] = rVar4;
          local_34 = local_34 + 1;
          if (local_34 < *in_RDI) {
            uVar10 = (uint)*(ushort *)(*(long *)(in_RDI + 2) + (long)local_34 * 4);
            uVar8 = uVar10 + *(ushort *)(*(long *)(in_RDI + 2) + 2 + (long)local_34 * 4) + 1;
          }
        }
      }
      if (local_34 < *in_RDI) {
        iVar1 = prVar11->n_runs;
        prVar11->n_runs = iVar1 + 1;
        rVar5.length = ((short)uVar8 - uVar14) - 1;
        rVar5.value = uVar14;
        prVar11->runs[iVar1] = rVar5;
        local_34 = local_34 + 1;
        if (local_34 < *in_RDI) {
          memcpy(prVar11->runs + prVar11->n_runs,
                 (void *)(*(long *)(in_RDI + 2) + (long)local_34 * 4),
                 (long)(*in_RDI - local_34) << 2);
          prVar11->n_runs = (*in_RDI - local_34) + prVar11->n_runs;
        }
      }
      pcVar12 = convert_run_to_efficient_container
                          ((run_container_t *)CONCAT44(iVar7,uVar15),(uint8_t *)prVar11);
      *in_RDX = (long)pcVar12;
      if (prVar11 != (run_container_t *)*in_RDX) {
        run_container_free((run_container_t *)0x12678c);
      }
      local_4 = (uint)local_55;
    }
  }
  else if (iVar7 < 0x1001) {
    paVar13 = array_container_create_given_capacity(in_stack_ffffffffffffff8c);
    iVar7 = run_array_array_subtract
                      ((run_container_t *)
                       CONCAT26(in_stack_ffffffffffffffc6,
                                CONCAT24(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)),
                       (array_container_t *)
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                       (array_container_t *)
                       CONCAT26(in_stack_ffffffffffffffb6,
                                CONCAT24(in_stack_ffffffffffffffb4,
                                         CONCAT22(in_stack_ffffffffffffffb2,
                                                  in_stack_ffffffffffffffb0))));
    paVar13->cardinality = iVar7;
    *in_RDX = (long)paVar13;
    local_4 = 2;
  }
  else {
    src_1_00 = bitset_container_from_run(in_stack_ffffffffffffffa0);
    _Var6 = bitset_array_container_iandnot
                      (src_1_00,(array_container_t *)
                                CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                       (container_t **)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
                      );
    local_4 = 2;
    if (_Var6) {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

int run_array_container_andnot(const run_container_t *src_1,
                               const array_container_t *src_2,
                               container_t **dst) {
    // follows the Java impl as of June 2016

    int card = run_container_cardinality(src_1);
    const int arbitrary_threshold = 32;

    if (card <= arbitrary_threshold) {
        if (src_2->cardinality == 0) {
            *dst = run_container_clone(src_1);
            return RUN_CONTAINER_TYPE;
        }
        // Java's "lazyandNot.toEfficientContainer" thing
        run_container_t *answer = run_container_create_given_capacity(
            card + array_container_cardinality(src_2));

        int rlepos = 0;
        int xrlepos = 0;  // "x" is src_2
        rle16_t rle = src_1->runs[rlepos];
        int32_t start = rle.value;
        int32_t end = start + rle.length + 1;
        int32_t xstart = src_2->array[xrlepos];

        while ((rlepos < src_1->n_runs) && (xrlepos < src_2->cardinality)) {
            if (end <= xstart) {
                // output the first run
                answer->runs[answer->n_runs++] =
                    CROARING_MAKE_RLE16(start, end - start - 1);
                rlepos++;
                if (rlepos < src_1->n_runs) {
                    start = src_1->runs[rlepos].value;
                    end = start + src_1->runs[rlepos].length + 1;
                }
            } else if (xstart + 1 <= start) {
                // exit the second run
                xrlepos++;
                if (xrlepos < src_2->cardinality) {
                    xstart = src_2->array[xrlepos];
                }
            } else {
                if (start < xstart) {
                    answer->runs[answer->n_runs++] =
                        CROARING_MAKE_RLE16(start, xstart - start - 1);
                }
                if (xstart + 1 < end) {
                    start = xstart + 1;
                } else {
                    rlepos++;
                    if (rlepos < src_1->n_runs) {
                        start = src_1->runs[rlepos].value;
                        end = start + src_1->runs[rlepos].length + 1;
                    }
                }
            }
        }
        if (rlepos < src_1->n_runs) {
            answer->runs[answer->n_runs++] =
                CROARING_MAKE_RLE16(start, end - start - 1);
            rlepos++;
            if (rlepos < src_1->n_runs) {
                memcpy(answer->runs + answer->n_runs, src_1->runs + rlepos,
                       (src_1->n_runs - rlepos) * sizeof(rle16_t));
                answer->n_runs += (src_1->n_runs - rlepos);
            }
        }
        uint8_t return_type;
        *dst = convert_run_to_efficient_container(answer, &return_type);
        if (answer != *dst) run_container_free(answer);
        return return_type;
    }
    // else it's a bitmap or array

    if (card <= DEFAULT_MAX_SIZE) {
        array_container_t *ac = array_container_create_given_capacity(card);
        // nb Java code used a generic iterator-based merge to compute
        // difference
        ac->cardinality = run_array_array_subtract(src_1, src_2, ac);
        *dst = ac;
        return ARRAY_CONTAINER_TYPE;
    }
    bitset_container_t *ans = bitset_container_from_run(src_1);
    bool result_is_bitset = bitset_array_container_iandnot(ans, src_2, dst);
    return (result_is_bitset ? BITSET_CONTAINER_TYPE : ARRAY_CONTAINER_TYPE);
}